

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_aconst_null(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  Frame::pushIntoOperandStack(this_01,(Value)ZEXT816(0x900000000));
  this_01->pc = this_01->pc + 1;
  return;
}

Assistant:

void ExecutionEngine::i_aconst_null() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value;
    value.type = ValueType::REFERENCE;
    value.data.object = NULL;

    topFrame->pushIntoOperandStack(value);

    topFrame->pc += 1;
}